

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

time_t Curl_timeleft(Curl_easy *data,timeval *nowp,_Bool duringconnect)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  __suseconds_t *p_Var4;
  time_t tVar5;
  time_t tVar6;
  char cVar7;
  undefined7 in_register_00000011;
  long lVar8;
  timeval tVar9;
  timeval newer;
  __suseconds_t local_28;
  __time_t local_20;
  
  p_Var4 = &local_28;
  lVar1 = (data->set).timeout;
  bVar2 = 0 < lVar1;
  lVar3 = 0;
  cVar7 = bVar2;
  if (((int)CONCAT71(in_register_00000011,duringconnect) != 0) &&
     (lVar3 = 300000, cVar7 = bVar2 + '\x02', (data->set).connecttimeout < 1)) {
    cVar7 = bVar2;
  }
  lVar8 = lVar1;
  if (cVar7 != '\x01') {
    if (cVar7 == '\x03') {
      lVar8 = (data->set).connecttimeout;
      if (lVar1 < lVar8) {
        lVar8 = lVar1;
      }
    }
    else if (cVar7 == '\x02') {
      lVar8 = (data->set).connecttimeout;
    }
    else {
      lVar8 = lVar3;
      if (!duringconnect) {
        return 0;
      }
    }
  }
  if (nowp == (timeval *)0x0) {
    tVar9 = curlx_tvnow();
    nowp = (timeval *)&local_20;
    local_20 = tVar9.tv_sec;
    local_28 = tVar9.tv_usec;
  }
  else {
    p_Var4 = &nowp->tv_usec;
  }
  tVar9.tv_usec = (data->progress).speeder[(ulong)!duringconnect * 2 + -0xb];
  tVar9.tv_sec = (data->progress).speeder[(ulong)!duringconnect * 2 + -0xc];
  newer.tv_usec = *p_Var4;
  newer.tv_sec = nowp->tv_sec;
  tVar5 = curlx_tvdiff(newer,tVar9);
  tVar6 = -1;
  if (lVar8 - tVar5 != 0) {
    tVar6 = lVar8 - tVar5;
  }
  return tVar6;
}

Assistant:

time_t Curl_timeleft(struct Curl_easy *data,
                     struct timeval *nowp,
                     bool duringconnect)
{
  int timeout_set = 0;
  time_t timeout_ms = duringconnect?DEFAULT_CONNECT_TIMEOUT:0;
  struct timeval now;

  /* if a timeout is set, use the most restrictive one */

  if(data->set.timeout > 0)
    timeout_set |= 1;
  if(duringconnect && (data->set.connecttimeout > 0))
    timeout_set |= 2;

  switch(timeout_set) {
  case 1:
    timeout_ms = data->set.timeout;
    break;
  case 2:
    timeout_ms = data->set.connecttimeout;
    break;
  case 3:
    if(data->set.timeout < data->set.connecttimeout)
      timeout_ms = data->set.timeout;
    else
      timeout_ms = data->set.connecttimeout;
    break;
  default:
    /* use the default */
    if(!duringconnect)
      /* if we're not during connect, there's no default timeout so if we're
         at zero we better just return zero and not make it a negative number
         by the math below */
      return 0;
    break;
  }

  if(!nowp) {
    now = Curl_tvnow();
    nowp = &now;
  }

  /* subtract elapsed time */
  if(duringconnect)
    /* since this most recent connect started */
    timeout_ms -= Curl_tvdiff(*nowp, data->progress.t_startsingle);
  else
    /* since the entire operation started */
    timeout_ms -= Curl_tvdiff(*nowp, data->progress.t_startop);
  if(!timeout_ms)
    /* avoid returning 0 as that means no timeout! */
    return -1;

  return timeout_ms;
}